

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O0

MyCompiler * __thiscall
MyCompiler::visitExpression
          (MyCompiler *this,Expression *ast,
          vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
          *result,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *usedIdents,int *tempIdentCounter)

{
  bool bVar1;
  element_type *ast_00;
  element_type *peVar2;
  reference ppVar3;
  string *local_288;
  bool local_209;
  undefined1 local_200 [64];
  string asStack_1c0 [32];
  string asStack_1a0 [32];
  MyCompiler local_180 [32];
  MyCompiler local_160 [8];
  string secondTerm;
  pair<MyCompiler::AddSubOp,_MyCompiler::Term> *item;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
  *__range1;
  string *local_118;
  undefined1 local_110 [64];
  string asStack_d0 [32];
  string asStack_b0 [32];
  MyCompiler local_90 [38];
  undefined1 local_6a;
  byte local_69;
  undefined4 local_68;
  bool moreTerm;
  bool local_51;
  MyCompiler local_50 [7];
  bool negative;
  string aTerm;
  int *tempIdentCounter_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *usedIdents_local;
  vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
  *result_local;
  Expression *ast_local;
  string *temp;
  
  ast_00 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ast->pTerm);
  visitTerm(local_50,ast_00,result,usedIdents,tempIdentCounter);
  bVar1 = std::operator!=(&ast->pAddSubOp,(nullptr_t)0x0);
  local_209 = false;
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ast->pAddSubOp);
    local_209 = std::operator==(&(peVar2->super_AbstractAstNode).value,"-");
  }
  local_51 = local_209;
  if ((local_209 == false) &&
     (bVar1 = std::
              vector<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
              ::empty(&ast->vAddSubOpExpression), bVar1)) {
    std::__cxx11::string::string((string *)this,(string *)local_50);
  }
  else {
    local_69 = 0;
    local_6a = 0;
    std::__cxx11::string::string((string *)this);
    if ((local_51 & 1U) != 0) {
      nextTempIdent(local_90,usedIdents,tempIdentCounter);
      std::__cxx11::string::operator=((string *)this,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      local_69 = 1;
      __range1._5_1_ = 1;
      local_118 = (string *)local_110;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_110,"*",(allocator *)((long)&__range1 + 7));
      local_118 = (string *)(local_110 + 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_110 + 0x20),"-1",(allocator *)((long)&__range1 + 6));
      local_118 = asStack_d0;
      std::__cxx11::string::string(local_118,(string *)local_50);
      local_118 = asStack_b0;
      std::__cxx11::string::string(local_118,(string *)this);
      __range1._5_1_ = 0;
      std::
      vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
      ::push_back(result,(value_type *)local_110);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              *)local_110);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    }
    __end1 = std::
             vector<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
             ::begin(&ast->vAddSubOpExpression);
    item = (pair<MyCompiler::AddSubOp,_MyCompiler::Term> *)
           std::
           vector<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
           ::end(&ast->vAddSubOpExpression);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_*,_std::vector<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>_>
                                       *)&item), bVar1) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_*,_std::vector<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>_>
               ::operator*(&__end1);
      visitTerm(local_160,&ppVar3->second,result,usedIdents,tempIdentCounter);
      if ((local_69 & 1) == 0) {
        nextTempIdent(local_180,usedIdents,tempIdentCounter);
        std::__cxx11::string::operator=((string *)this,(string *)local_180);
        std::__cxx11::string::~string((string *)local_180);
      }
      std::__cxx11::string::string
                ((string *)local_200,(string *)&(ppVar3->first).super_AbstractAstNode.value);
      local_288 = (string *)this;
      if ((local_69 & 1) == 0) {
        local_288 = (string *)local_50;
      }
      std::__cxx11::string::string((string *)(local_200 + 0x20),local_288);
      std::__cxx11::string::string(asStack_1c0,(string *)local_160);
      std::__cxx11::string::string(asStack_1a0,(string *)this);
      std::
      vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
      ::push_back(result,(value_type *)local_200);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              *)local_200);
      local_69 = 1;
      std::__cxx11::string::~string((string *)local_160);
      __gnu_cxx::
      __normal_iterator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_*,_std::vector<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>_>
      ::operator++(&__end1);
    }
    local_6a = 1;
  }
  local_68 = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this;
}

Assistant:

std::string MyCompiler::visitExpression(MyCompiler::Expression &ast,
                                        std::vector<std::array<std::string, 4>> &result,
                                        std::unordered_set<std::string> &usedIdents,
                                        int &tempIdentCounter)
{
    std::string aTerm = visitTerm(*ast.pTerm, result, usedIdents, tempIdentCounter);

    bool negative = ast.pAddSubOp != nullptr && ast.pAddSubOp->value == "-";
    if (!negative && ast.vAddSubOpExpression.empty())
        return aTerm;

    bool moreTerm = false;
    std::string temp;

    if (negative)
    {
        temp = nextTempIdent(usedIdents, tempIdentCounter);
        moreTerm = true;
        result.push_back({"*", "-1", aTerm, temp});
    }

    for (auto &item : ast.vAddSubOpExpression)
    {
        std::string secondTerm = visitTerm(item.second, result, usedIdents, tempIdentCounter);
        if (!moreTerm)
            temp = nextTempIdent(usedIdents, tempIdentCounter);
        result.push_back({item.first.value,
                          moreTerm ? temp : aTerm,
                          secondTerm,
                          temp});
        moreTerm = true;
    }

    return temp;
}